

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_50a29::SequenceExpr::parse_non_term(SequenceExpr *this,Context *con)

{
  uint uVar1;
  int iVar2;
  element_type *peVar3;
  Context *con_local;
  SequenceExpr *this_local;
  
  peVar3 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&(this->super_BinaryExpr).left);
  uVar1 = (*peVar3->_vptr_Expr[2])(peVar3,con);
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    pegmatite::Context::parse_ws(con);
    peVar3 = std::__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pegmatite::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(this->super_BinaryExpr).right);
    iVar2 = (*peVar3->_vptr_Expr[2])(peVar3,con);
    this_local._7_1_ = (bool)((byte)iVar2 & 1);
  }
  return this_local._7_1_;
}

Assistant:

virtual bool parse_non_term(Context &con) const
	{
		if (!left->parse_non_term(con)) return false;
		con.parse_ws();
		return right->parse_non_term(con);
	}